

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_cbc_mode.c
# Opt level: O2

int tc_cbc_mode_decrypt(uint8_t *out,uint outlen,uint8_t *in,uint inlen,uint8_t *iv,
                       TCAesKeySched_t sched)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte local_48 [8];
  uint8_t buffer [16];
  
  buffer._8_8_ = sched;
  iVar1 = 0;
  if ((((outlen == inlen) && (((inlen | outlen) & 0xf) == 0)) && (outlen != 0)) &&
     (((inlen != 0 && (out != (uint8_t *)0x0)) &&
      ((in != (uint8_t *)0x0 && (sched != (TCAesKeySched_t)0x0)))))) {
    uVar2 = 0;
    for (uVar4 = 0; inlen != (uint)uVar4; uVar4 = uVar4 + 1) {
      if ((uVar4 & 0xf) == 0) {
        tc_aes_decrypt(local_48,in,(TCAesKeySched_t)buffer._8_8_);
        in = in + 0x10;
        uVar2 = 0;
      }
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
      out[uVar4] = iv[uVar4] ^ local_48[uVar3];
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int tc_cbc_mode_decrypt(uint8_t *out, unsigned int outlen, const uint8_t *in,
			    unsigned int inlen, const uint8_t *iv,
			    const TCAesKeySched_t sched)
{

	uint8_t buffer[TC_AES_BLOCK_SIZE];
	const uint8_t *p;
	unsigned int n, m;

	/* sanity check the inputs */
	if (out == (uint8_t *) 0 ||
	    in == (const uint8_t *) 0 ||
	    sched == (TCAesKeySched_t) 0 ||
	    inlen == 0 ||
	    outlen == 0 ||
	    (inlen % TC_AES_BLOCK_SIZE) != 0 ||
	    (outlen % TC_AES_BLOCK_SIZE) != 0 ||
	    outlen != inlen) {
		return TC_CRYPTO_FAIL;
	}

	/*
	 * Note that in == iv + ciphertext, i.e. the iv and the ciphertext are
	 * contiguous. This allows for a very efficient decryption algorithm
	 * that would not otherwise be possible.
	 */
	p = iv;
	for (n = m = 0; n < outlen; ++n) {
		if ((n % TC_AES_BLOCK_SIZE) == 0) {
			(void)tc_aes_decrypt(buffer, in, sched);
			in += TC_AES_BLOCK_SIZE;
			m = 0;
		}
		*out++ = buffer[m++] ^ *p++;
	}

	return TC_CRYPTO_SUCCESS;
}